

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

void __thiscall soul::Value::Value(Value *this,complex<double> v)

{
  undefined8 extraout_RDX;
  complex<double> newValue;
  Type local_40;
  PackedData local_28;
  
  local_40.category = primitive;
  local_40.arrayElementCategory = invalid;
  local_40.isRef = false;
  local_40.isConstant = false;
  local_40.primitiveType.type = complex64;
  local_40.boundingSize = 0;
  local_40.arrayElementBoundingSize = 0;
  local_40.structure.object = (Structure *)0x0;
  Value(this,&local_40);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_40.structure);
  getData(&local_28,this);
  newValue._M_value._8_8_ = extraout_RDX;
  newValue._M_value._0_8_ = this;
  PackedData::setAs<std::complex<double>>(&local_28,newValue);
  return;
}

Assistant:

Value::Value (std::complex<double> v) : Value (Type (PrimitiveType::complex64))   { getData().setAs (v); }